

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void basic_suite::test_false_white(void)

{
  char input [10];
  decoder_type decoder;
  undefined4 local_158;
  value local_154;
  value_type local_150 [16];
  basic_decoder<char> local_140;
  
  local_140.input.tail = local_150 + 9;
  builtin_memcpy(local_150,"  false  ",10);
  local_140.input.head = local_150;
  memset(&local_140.current,0,0x120);
  local_140.current.code = uninitialized;
  local_140.current.view.head = (const_pointer)0x0;
  local_140.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_140);
  local_154 = local_140.current.code;
  local_158 = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::false_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x114,"void basic_suite::test_false_white()",&local_154,&local_158);
  if (error_unexpected_token < local_140.current.code) {
    if (local_140.current.code == end) {
      local_140.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_140);
    }
  }
  local_154 = local_140.current.code;
  local_158 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x116,"void basic_suite::test_false_white()",&local_154,&local_158);
  return;
}

Assistant:

void test_false_white()
{
    const char input[] = "  false  ";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::false_value);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}